

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::SetConfigType(cmCTest *this,char *ct)

{
  string *source;
  string confTypeEnv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  source = &this->ConfigType;
  std::__cxx11::string::assign((char *)source);
  cmsys::SystemTools::ReplaceString(source,".\\","");
  std::operator+(&local_30,"CMAKE_CONFIG_TYPE=",source);
  cmsys::SystemTools::PutEnv(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmCTest::SetConfigType(const char* ct)
{
  this->ConfigType = ct ? ct : "";
  cmSystemTools::ReplaceString(this->ConfigType, ".\\", "");
  std::string confTypeEnv = "CMAKE_CONFIG_TYPE=" + this->ConfigType;
  cmSystemTools::PutEnv(confTypeEnv);
}